

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void CVmBifTADS::re_search_common<_1>(uint argc)

{
  vm_val_t *pvVar1;
  vm_globalvar_t *pvVar2;
  CRegexSearcherSimple *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  vm_datatype_t *pvVar5;
  vm_val_t *pvVar6;
  undefined4 uVar7;
  vm_val_t *pvVar8;
  int iVar9;
  vm_obj_id_t vVar10;
  ushort *puVar11;
  byte *pbVar12;
  int iVar13;
  ushort *puVar14;
  byte *pbVar15;
  ushort *puVar16;
  size_t bytelen;
  int iVar17;
  vm_obj_id_t vVar18;
  char *pcVar19;
  int32_t iVar20;
  ushort *puVar21;
  ushort *entirestr;
  vm_obj_id_t vVar22;
  int match_len;
  char buf [17];
  int local_60;
  uint local_5c;
  char local_58 [7];
  char local_51 [5];
  char local_4c [12];
  vm_val_t local_40;
  
  CVmBif::check_argc_range(argc,2,3);
  pvVar8 = sp_;
  pvVar1 = sp_ + -3;
  pvVar6 = sp_ + -2;
  uVar7 = *(undefined4 *)&sp_[-2].field_0x4;
  aVar4 = sp_[-2].val;
  sp_ = sp_ + 1;
  pvVar8->typ = pvVar6->typ;
  *(undefined4 *)&pvVar8->field_0x4 = uVar7;
  pvVar8->val = aVar4;
  pvVar6 = sp_;
  iVar20 = 0;
  uVar7 = *(undefined4 *)&pvVar8[-1].field_0x4;
  aVar4 = pvVar8[-1].val;
  sp_ = sp_ + 1;
  pvVar6->typ = pvVar8[-1].typ;
  *(undefined4 *)&pvVar6->field_0x4 = uVar7;
  pvVar6->val = aVar4;
  if (2 < argc) {
    if (pvVar1->typ != VM_INT) {
      err_throw(0x900);
    }
    iVar20 = pvVar8[-3].val.intval;
  }
  pvVar2 = G_bif_tads_globals_X->last_rex_str;
  uVar7 = *(undefined4 *)&pvVar8[-2].field_0x4;
  aVar4 = pvVar8[-2].val;
  (pvVar2->val).typ = pvVar8[-2].typ;
  *(undefined4 *)&(pvVar2->val).field_0x4 = uVar7;
  (pvVar2->val).val = aVar4;
  pCVar3 = G_bif_tads_globals_X->rex_searcher;
  *(undefined4 *)&pCVar3->field_0x64 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x68 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x6c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x70 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x54 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x58 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x5c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x60 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x44 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x48 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x4c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x50 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x34 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x38 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x3c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x40 = 0xffffffff;
  *(undefined4 *)&(pCVar3->super_CRegexSearcher).field_0x24 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x28 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x2c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x30 = 0xffffffff;
  (pCVar3->match_).start_ofs = -1;
  (pCVar3->match_).end_ofs = -1;
  if ((sp_[-1].typ == VM_OBJ) &&
     (iVar9 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                     [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                         CVmObjPattern::metaclass_reg_), iVar9 != 0)) {
    pcVar19 = (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]->ptr_).obj_ +
              (sp_[-1].val.obj & 0xfff) * 0x18;
    puVar14 = (ushort *)0x0;
    sp_ = sp_ + -1;
  }
  else {
    pcVar19 = (char *)0x0;
    puVar14 = (ushort *)CVmBif::pop_str_val();
  }
  puVar11 = (ushort *)CVmBif::pop_str_val();
  pbVar12 = (byte *)(ulong)*puVar11;
  entirestr = puVar11 + 1;
  if (iVar20 < 0) {
    if (pbVar12 != (byte *)0x0) {
      iVar9 = 0;
      puVar16 = entirestr;
      do {
        puVar16 = (ushort *)
                  ((long)puVar16 +
                  (ulong)((((byte)*puVar16 >> 5 & 1) != 0) + 1 &
                         (uint)(byte)((byte)*puVar16 >> 7) * 3) + 1);
        iVar9 = iVar9 + 1;
      } while (puVar16 < (ushort *)((long)entirestr + (long)pbVar12));
      goto LAB_00261ada;
    }
  }
  else {
    iVar9 = -1;
    if (iVar20 != 0) goto LAB_00261ada;
    if (pbVar12 != (byte *)0x0) {
      iVar9 = 0;
      puVar16 = entirestr;
      do {
        puVar16 = (ushort *)
                  ((long)puVar16 +
                  (ulong)((((byte)*puVar16 >> 5 & 1) != 0) + 1 &
                         (uint)(byte)((byte)*puVar16 >> 7) * 3) + 1);
        iVar9 = iVar9 + 1;
      } while (puVar16 < (ushort *)((long)entirestr + (long)pbVar12));
      goto LAB_00261ada;
    }
  }
  iVar9 = 0;
LAB_00261ada:
  iVar17 = iVar9 + iVar20;
  puVar16 = entirestr;
  puVar21 = entirestr;
  iVar13 = iVar17;
  if (*puVar11 != 0 && (iVar17 != 0 && SCARRY4(iVar9,iVar20) == iVar17 < 0)) {
    do {
      puVar16 = (ushort *)
                ((long)puVar21 +
                (ulong)((((byte)*puVar21 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*puVar21 >> 7) * 3
                       ) + 1);
      pbVar12 = (byte *)((long)puVar21 + ((long)pbVar12 - (long)puVar16));
      if (iVar13 < 2) break;
      puVar21 = puVar16;
      iVar13 = iVar13 + -1;
    } while (pbVar12 != (byte *)0x0);
  }
  if (pcVar19 == (char *)0x0) {
    iVar9 = CRegexSearcherSimple::compile_and_search_back
                      (G_bif_tads_globals_X->rex_searcher,(char *)(puVar14 + 1),(ulong)*puVar14,
                       (char *)entirestr,(char *)puVar16,(size_t)pbVar12,&local_60);
  }
  else {
    iVar9 = CRegexSearcherSimple::search_back_for_pattern
                      (G_bif_tads_globals_X->rex_searcher,
                       (re_compiled_pattern *)**(undefined8 **)(pcVar19 + 8),(char *)entirestr,
                       (char *)puVar16,(size_t)pbVar12,&local_60);
  }
  local_5c = argc;
  if (iVar9 < 0) {
    CVmBif::retval_nil();
  }
  else {
    if (iVar17 - iVar9 < 1) {
      vVar18 = 1;
    }
    else {
      puVar14 = (ushort *)((long)(iVar17 - iVar9) + (long)entirestr);
      vVar18 = 1;
      do {
        entirestr = (ushort *)
                    ((long)entirestr +
                    (ulong)((((byte)*entirestr >> 5 & 1) != 0) + 1 &
                           (uint)(byte)((byte)*entirestr >> 7) * 3) + 1);
        vVar18 = vVar18 + 1;
      } while (entirestr < puVar14);
    }
    pbVar12 = (byte *)((long)puVar16 + (long)-iVar9);
    bytelen = (size_t)local_60;
    if ((long)bytelen < 1) {
      vVar22 = 0;
    }
    else {
      vVar22 = 0;
      pbVar15 = pbVar12;
      do {
        pbVar15 = pbVar15 + (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3) + 1;
        vVar22 = vVar22 + 1;
      } while (pbVar15 < pbVar12 + bytelen);
    }
    vVar10 = CVmObjString::create(0,(char *)pbVar12,bytelen);
    pvVar1 = sp_;
    pvVar5 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar5 = VM_OBJ;
    (pvVar1->val).obj = vVar10;
    local_58[0] = '\x03';
    local_58[1] = '\0';
    local_40.typ = VM_INT;
    local_40.val.obj = vVar18;
    vmb_put_dh(local_58 + 2,&local_40);
    local_40.typ = VM_INT;
    local_40.val.obj = vVar22;
    vmb_put_dh(local_51,&local_40);
    local_40.typ = VM_OBJ;
    local_40.val.obj = vVar10;
    vmb_put_dh(local_4c,&local_40);
    vVar18 = CVmObjList::create(0,local_58);
    CVmBif::retval_obj(vVar18);
    sp_ = sp_ + -1;
  }
  sp_ = sp_ + -(long)(int)local_5c;
  return;
}

Assistant:

inline void CVmBifTADS::re_search_common(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    vm_val_t *v1 = G_stk->get(0);
    vm_val_t *v2 = G_stk->get(1);
    vm_val_t *v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    int start_idx = (dir > 0 ? 1 : 0);
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and clear out
     *   any old group registers (since they'd point into the old string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* check to see if we have a RexPattern object or an uncompiled string */
    const char *pat_str = 0;
    CVmObjPattern *pat_obj = 0;
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to search for the pattern */
    const char *str = pop_str_val(vmg0_);
    utf8_ptr p((char *)str + VMB_LEN);
    size_t len = vmb_get_len(str);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) :
                  start_idx == 0 && dir < 0 ? (int)p.len(len) :
                  -1);

    /* skip to the starting index */
    for (int i = start_idx ; i > 0 && len != 0 ; --i, p.inc(&len)) ;

    /* search for the pattern */
    int match_idx;
    int match_len;
    if (pat_obj != 0)
    {
        /* try finding the compiled pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->search_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->search_back_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }
    else
    {
        /* try finding the regular expression string pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->compile_and_search(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->compile_and_search_back(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }

    /* check for a match */
    if (match_idx >= 0)
    {
        /* 
         *   We found a match - calculate the character index of the match
         *   offset, adjusted to a 1-base.  The character index is simply the
         *   number of characters in the part of the string up to the match
         *   index.  Note that we have to add the starting index to get the
         *   actual index in the overall string, since 'p' points to the
         *   character at the starting index.  Also note that when searching
         *   backwards, the match index is the number of characters *before*
         *   the starting point.
         */
        size_t char_idx;
        if (dir > 0)
            char_idx = p.len(match_idx) + start_idx + 1;
        else
            char_idx = utf8_ptr::s_len(
                str + VMB_LEN, start_idx - match_idx) + 1;

        /* calculate the character length of the match */
        utf8_ptr matchp(p.getptr() + dir*match_idx);
        size_t char_len = matchp.len(match_len);

        /* allocate a string containing the match */
        vm_obj_id_t match_str_obj =
            CVmObjString::create(vmg_ FALSE, matchp.getptr(), match_len);

        /* push it momentarily as protection against garbage collection */
        G_stk->push()->set_obj(match_str_obj);

        /* 
         *   set up a 3-element list to contain the return value:
         *   [match_start_index, match_length, match_string] 
         */
        char buf[VMB_LEN + VMB_DATAHOLDER * 3];
        vmb_put_len(buf, 3);
        char *dst = buf + VMB_LEN;
        put_list_int(&dst, (long)char_idx);
        put_list_int(&dst, (long)char_len);
        put_list_obj(&dst, match_str_obj);

        /* allocate and return the list */
        retval_obj(vmg_ CVmObjList::create(vmg_ FALSE, buf));

        /* we no longer need the garbage collection protection */
        G_stk->discard();
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}